

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sasl_mssbcbs.c
# Opt level: O0

int saslmssbcbs_get_init_bytes
              (CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle,
              SASL_MECHANISM_BYTES *init_bytes)

{
  int local_1c;
  int result;
  SASL_MECHANISM_BYTES *init_bytes_local;
  CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle_local;
  
  if (sasl_mechanism_concrete_handle == (CONCRETE_SASL_MECHANISM_HANDLE)0x0) {
    local_1c = 0x2d;
  }
  else {
    init_bytes->bytes = (void *)0x0;
    init_bytes->length = 0;
    local_1c = 0;
  }
  return local_1c;
}

Assistant:

int saslmssbcbs_get_init_bytes(CONCRETE_SASL_MECHANISM_HANDLE sasl_mechanism_concrete_handle, SASL_MECHANISM_BYTES* init_bytes)
{
    int result;

    if (sasl_mechanism_concrete_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        init_bytes->bytes = NULL;
        init_bytes->length = 0;

        result = 0;
    }

    return result;
}